

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O2

void __thiscall TApp_CheckNameNoCase_Test::TestBody(TApp_CheckNameNoCase_Test *this)

{
  bool bVar1;
  Option *pOVar2;
  Option *pOVar3;
  Option *pOVar4;
  Option *pOVar5;
  Option *pOVar6;
  Option *pOVar7;
  App *this_00;
  char *in_R9;
  AssertHelper local_380;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_378;
  string local_370;
  AssertionResult gtest_ar_;
  int y;
  int x;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,"--long1",(allocator *)&local_370);
  std::__cxx11::string::string((string *)&local_70,"",(allocator *)&gtest_ar_);
  this_00 = &(this->super_TApp).app;
  pOVar2 = CLI::App::add_flag(this_00,&local_50,&local_70);
  pOVar2 = CLI::Option::ignore_case<CLI::App>(pOVar2,true);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_90,"--Long2",(allocator *)&local_370);
  std::__cxx11::string::string((string *)&local_b0,"",(allocator *)&gtest_ar_);
  pOVar3 = CLI::App::add_flag(this_00,&local_90,&local_b0);
  pOVar3 = CLI::Option::ignore_case<CLI::App>(pOVar3,true);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string((string *)&local_d0,"-a",(allocator *)&local_370);
  std::__cxx11::string::string((string *)&local_f0,"",(allocator *)&gtest_ar_);
  pOVar4 = CLI::App::add_flag(this_00,&local_d0,&local_f0);
  pOVar4 = CLI::Option::ignore_case<CLI::App>(pOVar4,true);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string((string *)&local_110,"-B",(allocator *)&local_370);
  std::__cxx11::string::string((string *)&local_130,"",(allocator *)&gtest_ar_);
  pOVar5 = CLI::App::add_flag(this_00,&local_110,&local_130);
  pOVar5 = CLI::Option::ignore_case<CLI::App>(pOVar5,true);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::string((string *)&local_150,"pos1",(allocator *)&local_370);
  std::__cxx11::string::string((string *)&local_170,"",(allocator *)&gtest_ar_);
  pOVar6 = CLI::App::add_option<int,_(CLI::detail::enabler)0>(this_00,&local_150,&x,&local_170);
  pOVar6 = CLI::Option::ignore_case<CLI::App>(pOVar6,true);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::string((string *)&local_190,"pOs2",(allocator *)&local_370);
  std::__cxx11::string::string((string *)&local_1b0,"",(allocator *)&gtest_ar_);
  pOVar7 = CLI::App::add_option<int,_(CLI::detail::enabler)0>(this_00,&local_190,&y,&local_1b0);
  pOVar7 = CLI::Option::ignore_case<CLI::App>(pOVar7,true);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::string((string *)&local_1d0,"--long1",(allocator *)&local_370);
  gtest_ar_.success_ = CLI::Option::check_name(pOVar2,&local_1d0);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__cxx11::string::~string((string *)&local_1d0);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_378);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_370,(internal *)&gtest_ar_,(AssertionResult *)"long1->check_name(\"--long1\")"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0xf1,local_370._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)&local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    std::__cxx11::string::~string((string *)&local_370);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_378);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__cxx11::string::string((string *)&local_1f0,"--lonG1",(allocator *)&local_370);
  gtest_ar_.success_ = CLI::Option::check_name(pOVar2,&local_1f0);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__cxx11::string::~string((string *)&local_1f0);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_378);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_370,(internal *)&gtest_ar_,(AssertionResult *)"long1->check_name(\"--lonG1\")"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0xf2,local_370._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)&local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    std::__cxx11::string::~string((string *)&local_370);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_378);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__cxx11::string::string((string *)&local_210,"--Long2",(allocator *)&local_370);
  gtest_ar_.success_ = CLI::Option::check_name(pOVar3,&local_210);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__cxx11::string::~string((string *)&local_210);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_378);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_370,(internal *)&gtest_ar_,(AssertionResult *)"long2->check_name(\"--Long2\")"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0xf4,local_370._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)&local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    std::__cxx11::string::~string((string *)&local_370);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_378);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__cxx11::string::string((string *)&local_230,"--long2",(allocator *)&local_370);
  gtest_ar_.success_ = CLI::Option::check_name(pOVar3,&local_230);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__cxx11::string::~string((string *)&local_230);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_378);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_370,(internal *)&gtest_ar_,(AssertionResult *)"long2->check_name(\"--long2\")"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0xf5,local_370._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)&local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    std::__cxx11::string::~string((string *)&local_370);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_378);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__cxx11::string::string((string *)&local_250,"-a",(allocator *)&local_370);
  gtest_ar_.success_ = CLI::Option::check_name(pOVar4,&local_250);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__cxx11::string::~string((string *)&local_250);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_378);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_370,(internal *)&gtest_ar_,(AssertionResult *)"short1->check_name(\"-a\")",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0xf7,local_370._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)&local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    std::__cxx11::string::~string((string *)&local_370);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_378);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__cxx11::string::string((string *)&local_270,"-A",(allocator *)&local_370);
  gtest_ar_.success_ = CLI::Option::check_name(pOVar4,&local_270);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__cxx11::string::~string((string *)&local_270);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_378);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_370,(internal *)&gtest_ar_,(AssertionResult *)"short1->check_name(\"-A\")",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0xf8,local_370._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)&local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    std::__cxx11::string::~string((string *)&local_370);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_378);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__cxx11::string::string((string *)&local_290,"-B",(allocator *)&local_370);
  gtest_ar_.success_ = CLI::Option::check_name(pOVar5,&local_290);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__cxx11::string::~string((string *)&local_290);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_378);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_370,(internal *)&gtest_ar_,(AssertionResult *)"short2->check_name(\"-B\")",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0xfa,local_370._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)&local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    std::__cxx11::string::~string((string *)&local_370);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_378);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__cxx11::string::string((string *)&local_2b0,"-b",(allocator *)&local_370);
  gtest_ar_.success_ = CLI::Option::check_name(pOVar5,&local_2b0);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__cxx11::string::~string((string *)&local_2b0);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_378);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_370,(internal *)&gtest_ar_,(AssertionResult *)"short2->check_name(\"-b\")",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0xfb,local_370._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)&local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    std::__cxx11::string::~string((string *)&local_370);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_378);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__cxx11::string::string((string *)&local_2d0,"pos1",(allocator *)&local_370);
  gtest_ar_.success_ = CLI::Option::check_name(pOVar6,&local_2d0);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__cxx11::string::~string((string *)&local_2d0);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_378);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_370,(internal *)&gtest_ar_,(AssertionResult *)"pos1->check_name(\"pos1\")",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0xfd,local_370._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)&local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    std::__cxx11::string::~string((string *)&local_370);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_378);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__cxx11::string::string((string *)&local_2f0,"poS1",(allocator *)&local_370);
  gtest_ar_.success_ = CLI::Option::check_name(pOVar6,&local_2f0);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__cxx11::string::~string((string *)&local_2f0);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_378);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_370,(internal *)&gtest_ar_,(AssertionResult *)"pos1->check_name(\"poS1\")",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0xfe,local_370._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)&local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    std::__cxx11::string::~string((string *)&local_370);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_378);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__cxx11::string::string((string *)&local_310,"pOs2",(allocator *)&local_370);
  gtest_ar_.success_ = CLI::Option::check_name(pOVar7,&local_310);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__cxx11::string::~string((string *)&local_310);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_378);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_370,(internal *)&gtest_ar_,(AssertionResult *)"pos2->check_name(\"pOs2\")",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0x100,local_370._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)&local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    std::__cxx11::string::~string((string *)&local_370);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_378);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__cxx11::string::string((string *)&local_330,"pos2",(allocator *)&local_370);
  bVar1 = CLI::Option::check_name(pOVar7,&local_330);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = bVar1;
  std::__cxx11::string::~string((string *)&local_330);
  if (!bVar1) {
    testing::Message::Message((Message *)&local_378);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_370,(internal *)&gtest_ar_,(AssertionResult *)"pos2->check_name(\"pos2\")",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0x101,local_370._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)&local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    std::__cxx11::string::~string((string *)&local_370);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_378);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  return;
}

Assistant:

TEST_F(TApp, CheckNameNoCase) {
    auto long1 = app.add_flag("--long1")->ignore_case();
    auto long2 = app.add_flag("--Long2")->ignore_case();
    auto short1 = app.add_flag("-a")->ignore_case();
    auto short2 = app.add_flag("-B")->ignore_case();
    int x, y;
    auto pos1 = app.add_option("pos1", x)->ignore_case();
    auto pos2 = app.add_option("pOs2", y)->ignore_case();

    EXPECT_TRUE(long1->check_name("--long1"));
    EXPECT_TRUE(long1->check_name("--lonG1"));

    EXPECT_TRUE(long2->check_name("--Long2"));
    EXPECT_TRUE(long2->check_name("--long2"));

    EXPECT_TRUE(short1->check_name("-a"));
    EXPECT_TRUE(short1->check_name("-A"));

    EXPECT_TRUE(short2->check_name("-B"));
    EXPECT_TRUE(short2->check_name("-b"));

    EXPECT_TRUE(pos1->check_name("pos1"));
    EXPECT_TRUE(pos1->check_name("poS1"));

    EXPECT_TRUE(pos2->check_name("pOs2"));
    EXPECT_TRUE(pos2->check_name("pos2"));
}